

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_readfile(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value *local_2090;
  int local_2068;
  int local_2064;
  int nLen;
  int rc;
  void *pHandle;
  char zBuf [8192];
  char *local_50;
  char *zFile;
  jx9_int64 nRead;
  jx9_int64 n;
  jx9_io_stream *pStream;
  jx9_value **ppjStack_28;
  int use_include;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream._4_4_ = 0;
  ppjStack_28 = apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a file path");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    local_50 = jx9_value_to_string(*ppjStack_28,&local_2068);
    n = (jx9_int64)jx9VmGetStreamDevice(pjStack_18->pVm,&local_50,local_2068);
    if ((jx9_io_stream *)n == (jx9_io_stream *)0x0) {
      jx9_context_throw_error(pjStack_18,2,"No such stream device, JX9 is returning FALSE");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      if (1 < apArg_local._4_4_) {
        pStream._4_4_ = jx9_value_to_bool(ppjStack_28[1]);
      }
      if (apArg_local._4_4_ < 3) {
        local_2090 = (jx9_value *)0x0;
      }
      else {
        local_2090 = ppjStack_28[2];
      }
      _nLen = jx9StreamOpenHandle(pjStack_18->pVm,(jx9_io_stream *)n,local_50,1,pStream._4_4_,
                                  local_2090,0,(int *)0x0);
      if (_nLen == (void *)0x0) {
        jx9_context_throw_error_format(pjStack_18,1,"IO error while opening \'%s\'",local_50);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        zFile = (char *)0x0;
        while ((nRead = (**(code **)(n + 0x30))(_nLen,&pHandle,0x2000), 0 < nRead &&
               (local_2064 = jx9_context_output(pjStack_18,(char *)&pHandle,(int)nRead),
               local_2064 != -10))) {
          zFile = zFile + nRead;
        }
        jx9StreamCloseHandle((jx9_io_stream *)n,_nLen);
        jx9_result_int64(pjStack_18,(jx9_int64)zFile);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_readfile(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int use_include  = FALSE;
	const jx9_io_stream *pStream;
	jx9_int64 n, nRead;
	const char *zFile;
	char zBuf[8192];
	void *pHandle;
	int rc, nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 1 ){
		use_include = jx9_value_to_bool(apArg[1]);
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, 
		use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = pStream->xRead(pHandle, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Output data */
		rc = jx9_context_output(pCtx, zBuf, (int)n);
		if( rc == JX9_ABORT ){
			break;
		}
		/* Increment counter */
		nRead += n;
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Total number of bytes readen */
	jx9_result_int64(pCtx, nRead);
	return JX9_OK;
}